

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

void __thiscall Database::initIndex(Database *this)

{
  void *pvVar1;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> index_filename;
  string *in_stack_00000058;
  IndexTree *in_stack_00000060;
  string local_28 [8];
  char *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  pvVar1 = operator_new(0x38);
  IndexTree::IndexTree(in_stack_00000060,in_stack_00000058);
  *(void **)(in_RDI + 0x60) = pvVar1;
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Database::initIndex() {
    auto index_filename = file_prefix + ".index";
    index = new IndexTree(index_filename);
}